

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

void __thiscall llvm::yaml::Output::outputUpToEndOfLine(Output *this,StringRef s)

{
  reference pIVar1;
  
  output(this,s);
  if ((this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
      super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
      super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.super_SmallVectorBase.Size
      != 0) {
    pIVar1 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                       ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)
                        &this->StateStack);
    if ((*pIVar1 & ~inSeqOtherElement) == inFlowSeqFirstElement) {
      return;
    }
    pIVar1 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                       ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)
                        &this->StateStack);
    if ((*pIVar1 & ~inSeqOtherElement) == inFlowMapFirstKey) {
      return;
    }
  }
  (this->Padding).Data = "\n";
  (this->Padding).Length = 1;
  return;
}

Assistant:

void Output::outputUpToEndOfLine(StringRef s) {
  output(s);
  if (StateStack.empty() || (!inFlowSeqAnyElement(StateStack.back()) &&
                             !inFlowMapAnyKey(StateStack.back())))
    Padding = "\n";
}